

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void update_next_job_info(AV1CdefSync *cdef_sync,int nvfb,int nhfb)

{
  int iVar1;
  
  iVar1 = cdef_sync->fbc + 1;
  cdef_sync->fbc = iVar1;
  if (iVar1 == nhfb) {
    iVar1 = cdef_sync->fbr + 1;
    cdef_sync->fbr = iVar1;
    if (iVar1 == nvfb) {
      cdef_sync->end_of_frame = 1;
      return;
    }
    cdef_sync->fbc = 0;
  }
  return;
}

Assistant:

static void update_next_job_info(AV1CdefSync *cdef_sync, int nvfb, int nhfb) {
  cdef_sync->fbc++;
  if (cdef_sync->fbc == nhfb) {
    cdef_sync->fbr++;
    if (cdef_sync->fbr == nvfb) {
      cdef_sync->end_of_frame = 1;
    } else {
      cdef_sync->fbc = 0;
    }
  }
}